

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::register_call_out_argument(CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  ulong uVar2;
  SPIRVariable *pSVar3;
  
  uVar2 = (ulong)id;
  Compiler::register_write(&this->super_Compiler,id);
  if ((uVar2 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar2].type == TypeVariable)) {
    pSVar3 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar2);
    flush_variable_declaration(this,(pSVar3->super_IVariant).self.id);
    return;
  }
  return;
}

Assistant:

void CompilerGLSL::register_call_out_argument(uint32_t id)
{
	register_write(id);

	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
		flush_variable_declaration(var->self);
}